

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

void Abc_ConvertZddToSop_rec
               (DdManager *dd,DdNode *zCover,char *pSop,int nFanins,Vec_Str_t *vCube,int fPhase,
               int *pnCubes)

{
  uint uVar1;
  DdNode *zC2;
  DdNode *zC1;
  DdNode *zC0;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  if (dd->zero != zCover) {
    if (dd->one == zCover) {
      sprintf(pSop + ((long)nFanins + 3) * (long)*pnCubes,"%s %d\n",vCube->pArray,fPhase);
      *pnCubes = *pnCubes + 1;
    }
    else {
      uVar1 = zCover->index >> 1;
      if (nFanins <= (int)uVar1) {
        __assert_fail("Index < nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                      ,0x1e0,
                      "void Abc_ConvertZddToSop_rec(DdManager *, DdNode *, char *, int, Vec_Str_t *, int, int *)"
                     );
      }
      extraDecomposeCover(dd,zCover,&local_38,&local_40,&local_48);
      vCube->pArray[uVar1] = '0';
      Abc_ConvertZddToSop_rec(dd,local_38,pSop,nFanins,vCube,fPhase,pnCubes);
      vCube->pArray[uVar1] = '1';
      Abc_ConvertZddToSop_rec(dd,local_40,pSop,nFanins,vCube,fPhase,pnCubes);
      vCube->pArray[uVar1] = '-';
      Abc_ConvertZddToSop_rec(dd,local_48,pSop,nFanins,vCube,fPhase,pnCubes);
    }
  }
  return;
}

Assistant:

void Abc_ConvertZddToSop_rec( DdManager * dd, DdNode * zCover, char * pSop, int nFanins, Vec_Str_t * vCube, int fPhase, int * pnCubes )
{
    DdNode * zC0, * zC1, * zC2;
    int Index;

    if ( zCover == dd->zero )
        return;
    if ( zCover == dd->one )
    {
        char * pCube;
        pCube = pSop + (*pnCubes) * (nFanins + 3);
        sprintf( pCube, "%s %d\n", vCube->pArray, fPhase );
        (*pnCubes)++;
        return;
    }
    Index = zCover->index/2;
    assert( Index < nFanins );
    extraDecomposeCover( dd, zCover, &zC0, &zC1, &zC2 );
    vCube->pArray[Index] = '0';
    Abc_ConvertZddToSop_rec( dd, zC0, pSop, nFanins, vCube, fPhase, pnCubes );
    vCube->pArray[Index] = '1';
    Abc_ConvertZddToSop_rec( dd, zC1, pSop, nFanins, vCube, fPhase, pnCubes );
    vCube->pArray[Index] = '-';
    Abc_ConvertZddToSop_rec( dd, zC2, pSop, nFanins, vCube, fPhase, pnCubes );
}